

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_test.cc
# Opt level: O0

void __thiscall
HMACTest_TestVectors_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,FileTest *t)

{
  pointer *ppuVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  uchar *puVar7;
  size_type sVar8;
  uchar *d;
  size_type n;
  pointer puVar9;
  pointer puVar10;
  HMAC_CTX *pHVar11;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var12;
  reference data;
  char *in_R9;
  AssertHelper local_760;
  Message local_758;
  Bytes local_750;
  Span<const_unsigned_char> local_740;
  Bytes local_730;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_6f0;
  Message local_6e8;
  int local_6dc;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_6a8;
  Message local_6a0;
  int local_694;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__13;
  size_t i;
  AssertHelper local_658;
  Message local_650;
  int local_644;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__12;
  Message local_628;
  Bytes local_620;
  Span<const_unsigned_char> local_610;
  Bytes local_600;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_5c0;
  Message local_5b8;
  int local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_578;
  Message local_570;
  int local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_530;
  Message local_528;
  int local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__9;
  Message local_500;
  Bytes local_4f8;
  Span<const_unsigned_char> local_4e8;
  Bytes local_4d8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_498;
  Message local_490;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_450;
  Message local_448;
  int local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_408;
  Message local_400;
  int local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__6;
  ScopedHMAC_CTX ctx;
  Message local_370;
  Bytes local_368;
  Span<const_unsigned_char> local_358;
  Bytes local_348;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_308;
  Message local_300;
  uchar *local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__5;
  uint mac_len;
  __array mac;
  Message local_2c8;
  size_type local_2c0;
  unsigned_long local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_280;
  Message local_278;
  allocator<char> local_269;
  string local_268;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_210;
  Message local_208;
  allocator<char> local_1f9;
  string local_1f8;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a0;
  Message local_198;
  allocator<char> local_189;
  string local_188;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  EVP_MD *digest;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  allocator<char> local_71;
  string local_70;
  bool local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  string digest_str;
  FileTest *t_local;
  anon_class_1_0_00000001 *this_local;
  
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"HMAC",&local_71);
  local_49 = FileTest::GetAttribute(t,(string *)&gtest_ar_.message_,&local_70);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&local_49,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar3) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_48,
               (AssertionResult *)"t->GetAttribute(&digest_str, \"HMAC\")","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
               ,0x31,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (bVar3) {
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )GetDigest((string *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<env_md_st_const*>
              ((AssertionResult *)local_d8,(env_md_st **)&gtest_ar__1.message_,(type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar3) {
      testing::Message::Message(&local_e0);
      pMVar6 = testing::Message::operator<<(&local_e0,(char (*) [17])"Unknown digest: ");
      pMVar6 = testing::Message::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)local_d8,
                 (AssertionResult *)0x83424e,"false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                 ,0x33,pcVar5);
      testing::internal::AssertHelper::operator=(&local_e8,pMVar6);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string
                ((string *)
                 &key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (bVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Key",&local_189);
      local_161 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &input.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_188);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_160,&local_161,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar3) {
        testing::Message::Message(&local_198);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_160,
                   (AssertionResult *)"t->GetBytes(&key, \"Key\")","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                   ,0x36,pcVar5);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Input",&local_1f9);
        local_1d1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &output.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       &local_1f8);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
        if (!bVar3) {
          testing::Message::Message(&local_208);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1d0,
                     (AssertionResult *)"t->GetBytes(&input, \"Input\")","false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_210,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                     ,0x37,pcVar5);
          testing::internal::AssertHelper::operator=(&local_210,&local_208);
          testing::internal::AssertHelper::~AssertHelper(&local_210);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_208);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"Output",&local_269);
          local_241 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &gtest_ar__2.message_,&local_268);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_240,&local_241,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_268);
          std::allocator<char>::~allocator(&local_269);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
          if (!bVar3) {
            testing::Message::Message(&local_278);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_240,
                       (AssertionResult *)"t->GetBytes(&output, \"Output\")","false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_280,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                       ,0x38,pcVar5);
            testing::internal::AssertHelper::operator=(&local_280,&local_278);
            testing::internal::AssertHelper::~AssertHelper(&local_280);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_278);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
          if (bVar3) {
            iVar4 = EVP_MD_size((EVP_MD *)
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
            local_2b8 = CONCAT44(extraout_var,iVar4);
            local_2c0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar__2.message_);
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_2b0,"EVP_MD_size(digest)","output.size()",&local_2b8,
                       &local_2c0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
            if (!bVar3) {
              testing::Message::Message(&local_2c8);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&mac,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                         ,0x39,pcVar5);
              testing::internal::AssertHelper::operator=((AssertHelper *)&mac,&local_2c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mac);
              testing::Message::~Message(&local_2c8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
            if (bVar3) {
              EVP_MD_size((EVP_MD *)
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
              std::make_unique<unsigned_char[]>((size_t)&stack0xfffffffffffffd28);
              uVar2 = gtest_ar__1.message_;
              ppuVar1 = &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
              sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
              ppuVar1 = &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
              d = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
              n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
              puVar9 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)&stack0xfffffffffffffd28);
              local_2f8 = HMAC((EVP_MD *)
                               uVar2._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,puVar7,(int)sVar8,d,n,puVar9,
                               (uint *)((long)&gtest_ar__5.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       + 4));
              testing::AssertionResult::AssertionResult<unsigned_char*>
                        ((AssertionResult *)local_2f0,&local_2f8,(type *)0x0);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
              if (!bVar3) {
                testing::Message::Message(&local_300);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1.message_,(internal *)local_2f0,
                           (AssertionResult *)
                           "HMAC(digest, key.data(), key.size(), input.data(), input.size(), mac.get(), &mac_len)"
                           ,"false","true",(char *)puVar9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_308,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x3f,pcVar5);
                testing::internal::AssertHelper::operator=(&local_308,&local_300);
                testing::internal::AssertHelper::~AssertHelper(&local_308);
                std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                testing::Message::~Message(&local_300);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
              if (bVar3) {
                bssl::Span<unsigned_char_const>::
                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((Span<unsigned_char_const> *)&local_358,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar__2.message_);
                Bytes::Bytes(&local_348,local_358);
                puVar10 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                          get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              &stack0xfffffffffffffd28);
                Bytes::Bytes(&local_368,puVar10,
                             (ulong)gtest_ar__5.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_);
                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                          ((EqHelper *)local_338,"Bytes(output)","Bytes(mac.get(), mac_len)",
                           &local_348,&local_368);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_338);
                if (!bVar3) {
                  testing::Message::Message(&local_370);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&ctx.ctx_.o_ctx.pctx_ops,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                             ,0x40,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&ctx.ctx_.o_ctx.pctx_ops,&local_370);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&ctx.ctx_.o_ctx.pctx_ops);
                  testing::Message::~Message(&local_370);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                ::StackAllocated((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                  *)&gtest_ar__6.message_);
                pHVar11 = (HMAC_CTX *)
                          bssl::internal::
                          StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::get
                                    ((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                      *)&gtest_ar__6.message_);
                ppuVar1 = &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1
                                   );
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1)
                ;
                local_3f4 = HMAC_Init_ex(pHVar11,puVar7,(int)sVar8,
                                         (EVP_MD *)
                                         gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl,(ENGINE *)0x0);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_3f0,&local_3f4,(type *)0x0);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_3f0);
                if (!bVar3) {
                  testing::Message::Message(&local_400);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_3f0,
                             (AssertionResult *)
                             "HMAC_Init_ex(ctx.get(), key.data(), key.size(), digest, nullptr)",
                             "false","true",(char *)puVar9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_408,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                             ,0x45,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_408,&local_400);
                  testing::internal::AssertHelper::~AssertHelper(&local_408);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_400);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
                if (bVar3) {
                  pHVar11 = (HMAC_CTX *)
                            bssl::internal::
                            StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::
                            get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                 *)&gtest_ar__6.message_);
                  ppuVar1 = &output.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      ppuVar1);
                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ppuVar1);
                  local_43c = HMAC_Update(pHVar11,puVar7,sVar8);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_438,&local_43c,(type *)0x0);
                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_438);
                  if (!bVar3) {
                    testing::Message::Message(&local_448);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__8.message_,(internal *)local_438,
                               (AssertionResult *)
                               "HMAC_Update(ctx.get(), input.data(), input.size())","false","true",
                               (char *)puVar9);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_450,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                               ,0x46,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_450,&local_448);
                    testing::internal::AssertHelper::~AssertHelper(&local_450);
                    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_448);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
                  if (bVar3) {
                    pHVar11 = (HMAC_CTX *)
                              bssl::internal::
                              StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::
                              get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                   *)&gtest_ar__6.message_);
                    puVar10 = std::
                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                              get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)&stack0xfffffffffffffd28);
                    local_484 = HMAC_Final(pHVar11,puVar10,
                                           (uint *)((long)&gtest_ar__5.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4));
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_480,&local_484,(type *)0x0);
                    bVar3 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_480);
                    if (!bVar3) {
                      testing::Message::Message(&local_490);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_2.message_,(internal *)local_480,
                                 (AssertionResult *)"HMAC_Final(ctx.get(), mac.get(), &mac_len)",
                                 "false","true",(char *)puVar9);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_498,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                 ,0x47,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_498,&local_490);
                      testing::internal::AssertHelper::~AssertHelper(&local_498);
                      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                      testing::Message::~Message(&local_490);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
                    if (bVar3) {
                      bssl::Span<unsigned_char_const>::
                      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((Span<unsigned_char_const> *)&local_4e8,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar__2.message_);
                      Bytes::Bytes(&local_4d8,local_4e8);
                      puVar10 = std::
                                unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                                get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                     *)&stack0xfffffffffffffd28);
                      Bytes::Bytes(&local_4f8,puVar10,
                                   (ulong)gtest_ar__5.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_);
                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                ((EqHelper *)local_4c8,"Bytes(output)","Bytes(mac.get(), mac_len)",
                                 &local_4d8,&local_4f8);
                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_4c8);
                      if (!bVar3) {
                        testing::Message::Message(&local_500);
                        pcVar5 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_4c8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                   ,0x48,pcVar5);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__9.message_,&local_500);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__9.message_);
                        testing::Message::~Message(&local_500);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
                      pHVar11 = (HMAC_CTX *)
                                bssl::internal::
                                StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                       *)&gtest_ar__6.message_);
                      local_51c = HMAC_Init_ex(pHVar11,(void *)0x0,0,
                                               (EVP_MD *)
                                               gtest_ar__1.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl,(ENGINE *)0x0);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_518,&local_51c,(type *)0x0);
                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_518);
                      if (!bVar3) {
                        testing::Message::Message(&local_528);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__10.message_,(internal *)local_518,
                                   (AssertionResult *)
                                   "HMAC_Init_ex(ctx.get(), nullptr, 0, digest, nullptr)","false",
                                   "true",(char *)puVar9);
                        pcVar5 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_530,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                   ,0x4b,pcVar5);
                        testing::internal::AssertHelper::operator=(&local_530,&local_528);
                        testing::internal::AssertHelper::~AssertHelper(&local_530);
                        std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                        testing::Message::~Message(&local_528);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
                      if (bVar3) {
                        pHVar11 = (HMAC_CTX *)
                                  bssl::internal::
                                  StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                  ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                         *)&gtest_ar__6.message_);
                        ppuVar1 = &output.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )ppuVar1);
                        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           ppuVar1);
                        local_564 = HMAC_Update(pHVar11,puVar7,sVar8);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_560,&local_564,(type *)0x0);
                        bVar3 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_560);
                        if (!bVar3) {
                          testing::Message::Message(&local_570);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__11.message_,(internal *)local_560,
                                     (AssertionResult *)
                                     "HMAC_Update(ctx.get(), input.data(), input.size())","false",
                                     "true",(char *)puVar9);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_578,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                     ,0x4c,pcVar5);
                          testing::internal::AssertHelper::operator=(&local_578,&local_570);
                          testing::internal::AssertHelper::~AssertHelper(&local_578);
                          std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                          testing::Message::~Message(&local_570);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
                        if (bVar3) {
                          pHVar11 = (HMAC_CTX *)
                                    bssl::internal::
                                    StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                    ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                           *)&gtest_ar__6.message_);
                          puVar10 = std::
                                    unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                    ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                           *)&stack0xfffffffffffffd28);
                          local_5ac = HMAC_Final(pHVar11,puVar10,
                                                 (uint *)((long)&gtest_ar__5.message_._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4));
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_5a8,&local_5ac,(type *)0x0);
                          bVar3 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_5a8);
                          if (!bVar3) {
                            testing::Message::Message(&local_5b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_3.message_,(internal *)local_5a8,
                                       (AssertionResult *)
                                       "HMAC_Final(ctx.get(), mac.get(), &mac_len)","false","true",
                                       (char *)puVar9);
                            pcVar5 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_5c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                       ,0x4d,pcVar5);
                            testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_5c0);
                            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                            testing::Message::~Message(&local_5b8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
                          if (bVar3) {
                            bssl::Span<unsigned_char_const>::
                            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ((Span<unsigned_char_const> *)&local_610,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &gtest_ar__2.message_);
                            Bytes::Bytes(&local_600,local_610);
                            puVar10 = std::
                                      unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                      ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                             *)&stack0xfffffffffffffd28);
                            Bytes::Bytes(&local_620,puVar10,
                                         (ulong)gtest_ar__5.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_);
                            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                      ((EqHelper *)local_5f0,"Bytes(output)",
                                       "Bytes(mac.get(), mac_len)",&local_600,&local_620);
                            bVar3 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_5f0);
                            if (!bVar3) {
                              testing::Message::Message(&local_628);
                              pcVar5 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_5f0);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                         ,0x4e,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar__12.message_,&local_628);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar__12.message_);
                              testing::Message::~Message(&local_628);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0)
                            ;
                            pHVar11 = (HMAC_CTX *)
                                      bssl::internal::
                                      StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                      ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                             *)&gtest_ar__6.message_);
                            local_644 = HMAC_Init_ex(pHVar11,(void *)0x0,0,(EVP_MD *)0x0,
                                                     (ENGINE *)0x0);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_640,&local_644,(type *)0x0);
                            bVar3 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_640);
                            if (!bVar3) {
                              testing::Message::Message(&local_650);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&i,(internal *)local_640,
                                         (AssertionResult *)
                                         "HMAC_Init_ex(ctx.get(), nullptr, 0, nullptr, nullptr)",
                                         "false","true",(char *)puVar9);
                              pcVar5 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_658,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                         ,0x51,pcVar5);
                              testing::internal::AssertHelper::operator=(&local_658,&local_650);
                              testing::internal::AssertHelper::~AssertHelper(&local_658);
                              std::__cxx11::string::~string((string *)&i);
                              testing::Message::~Message(&local_650);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_640)
                            ;
                            if (bVar3) {
                              for (gtest_ar__13.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl =
                                        (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                         )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0;
                                  uVar2._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl =
                                       gtest_ar__13.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl,
                                  _Var12.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl =
                                       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::size((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)&output.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ),
                                  (ulong)uVar2._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl <
                                  (ulong)_Var12.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                                  gtest_ar__13.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl =
                                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                        )((long)gtest_ar__13.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl + 1)) {
                                pHVar11 = (HMAC_CTX *)
                                          bssl::internal::
                                          StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                          ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                                 *)&gtest_ar__6.message_);
                                data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       operator[]((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&output.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(size_type)
                                                   gtest_ar__13.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                local_694 = HMAC_Update(pHVar11,data,1);
                                testing::AssertionResult::AssertionResult<int>
                                          ((AssertionResult *)local_690,&local_694,(type *)0x0);
                                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_690);
                                if (!bVar3) {
                                  testing::Message::Message(&local_6a0);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__14.message_,(internal *)local_690,
                                             (AssertionResult *)
                                             "HMAC_Update(ctx.get(), &input[i], 1)","false","true",
                                             (char *)puVar9);
                                  pcVar5 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_6a8,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                             ,0x53,pcVar5);
                                  testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_6a8);
                                  std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                                  testing::Message::~Message(&local_6a0);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_690);
                                if (!bVar3) goto LAB_00461a43;
                              }
                              pHVar11 = (HMAC_CTX *)
                                        bssl::internal::
                                        StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                        ::get((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                               *)&gtest_ar__6.message_);
                              puVar10 = std::
                                        unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                        ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                               *)&stack0xfffffffffffffd28);
                              local_6dc = HMAC_Final(pHVar11,puVar10,
                                                     (uint *)((long)&gtest_ar__5.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4));
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_6d8,&local_6dc,(type *)0x0);
                              bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_6d8);
                              if (!bVar3) {
                                testing::Message::Message(&local_6e8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_4.message_,(internal *)local_6d8,
                                           (AssertionResult *)
                                           "HMAC_Final(ctx.get(), mac.get(), &mac_len)","false",
                                           "true",(char *)puVar9);
                                pcVar5 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_6f0,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                           ,0x55,pcVar5);
                                testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
                                testing::internal::AssertHelper::~AssertHelper(&local_6f0);
                                std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                                testing::Message::~Message(&local_6e8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_6d8);
                              if (bVar3) {
                                bssl::Span<unsigned_char_const>::
                                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                          ((Span<unsigned_char_const> *)&local_740,
                                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &gtest_ar__2.message_);
                                Bytes::Bytes(&local_730,local_740);
                                puVar9 = std::
                                         unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                         ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                *)&stack0xfffffffffffffd28);
                                Bytes::Bytes(&local_750,puVar9,
                                             (ulong)gtest_ar__5.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                          ((EqHelper *)local_720,"Bytes(output)",
                                           "Bytes(mac.get(), mac_len)",&local_730,&local_750);
                                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_720);
                                if (!bVar3) {
                                  testing::Message::Message(&local_758);
                                  pcVar5 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_720);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_760,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                                             ,0x56,pcVar5);
                                  testing::internal::AssertHelper::operator=(&local_760,&local_758);
                                  testing::internal::AssertHelper::~AssertHelper(&local_760);
                                  testing::Message::~Message(&local_758);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_720);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_00461a43:
                bssl::internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                ::~StackAllocated((StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>
                                   *)&gtest_ar__6.message_);
              }
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &stack0xfffffffffffffd28);
            }
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(HMACTest, TestVectors) {
  FileTestGTest("crypto/hmac/hmac_tests.txt", [](FileTest *t) {
    std::string digest_str;
    ASSERT_TRUE(t->GetAttribute(&digest_str, "HMAC"));
    const EVP_MD *digest = GetDigest(digest_str);
    ASSERT_TRUE(digest) << "Unknown digest: " << digest_str;

    std::vector<uint8_t> key, input, output;
    ASSERT_TRUE(t->GetBytes(&key, "Key"));
    ASSERT_TRUE(t->GetBytes(&input, "Input"));
    ASSERT_TRUE(t->GetBytes(&output, "Output"));
    ASSERT_EQ(EVP_MD_size(digest), output.size());

    // Test using the one-shot API.
    auto mac = std::make_unique<uint8_t[]>(EVP_MD_size(digest));
    unsigned mac_len;
    ASSERT_TRUE(HMAC(digest, key.data(), key.size(), input.data(), input.size(),
                     mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test using HMAC_CTX.
    bssl::ScopedHMAC_CTX ctx;
    ASSERT_TRUE(
        HMAC_Init_ex(ctx.get(), key.data(), key.size(), digest, nullptr));
    ASSERT_TRUE(HMAC_Update(ctx.get(), input.data(), input.size()));
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test that an HMAC_CTX may be reset with the same key.
    ASSERT_TRUE(HMAC_Init_ex(ctx.get(), nullptr, 0, digest, nullptr));
    ASSERT_TRUE(HMAC_Update(ctx.get(), input.data(), input.size()));
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test feeding the input in byte by byte.
    ASSERT_TRUE(HMAC_Init_ex(ctx.get(), nullptr, 0, nullptr, nullptr));
    for (size_t i = 0; i < input.size(); i++) {
      ASSERT_TRUE(HMAC_Update(ctx.get(), &input[i], 1));
    }
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));
  });
}